

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::PizCompressor::PizCompressor
          (PizCompressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  int iVar1;
  ChannelList *pCVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  size_t sVar5;
  unsigned_short *puVar6;
  char *pcVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  ChannelData *pCVar10;
  Box2i *pBVar11;
  bool bVar12;
  ulong uVar13;
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__PizCompressor_0315f960;
  this->_maxScanLineSize = (int)maxScanLineSize;
  this->_format = XDR;
  this->_numScanLines = (int)numScanLines;
  this->_tmpBuffer = (unsigned_short *)0x0;
  this->_outBuffer = (char *)0x0;
  this->_numChans = 0;
  pCVar2 = Header::channels(hdr);
  this->_channels = pCVar2;
  this->_channelData = (ChannelData *)0x0;
  uVar3 = uiMult<unsigned_long>(maxScanLineSize,numScanLines);
  uVar4 = uiMult<unsigned_long>(maxScanLineSize,numScanLines);
  uVar4 = uiAdd<unsigned_long>(uVar4,0x12000);
  sVar5 = checkArraySize<unsigned_long>(uVar3 >> 1,2);
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)sVar5) {
    uVar13 = sVar5 * 2;
  }
  puVar6 = (unsigned_short *)operator_new__(uVar13);
  this->_tmpBuffer = puVar6;
  pcVar7 = (char *)operator_new__(uVar4);
  this->_outBuffer = pcVar7;
  pCVar2 = Header::channels((this->super_Compressor)._header);
  cVar8._M_node = (_Base_ptr)ChannelList::begin(pCVar2);
  bVar12 = true;
  while( true ) {
    CVar9 = ChannelList::end(pCVar2);
    iVar1 = this->_numChans;
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    this->_numChans = iVar1 + 1;
    if (cVar8._M_node[9]._M_color != _S_black) {
      bVar12 = false;
    }
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
  }
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar13 = (long)iVar1 << 5;
  }
  pCVar10 = (ChannelData *)operator_new__(uVar13);
  this->_channelData = pCVar10;
  pBVar11 = Header::dataWindow(hdr);
  this->_minX = (pBVar11->min).x;
  iVar1 = (pBVar11->max).y;
  this->_maxX = (pBVar11->max).x;
  this->_maxY = iVar1;
  if (bVar12) {
    iVar1 = pixelTypeSize(HALF);
    if (iVar1 == 2) {
      this->_format = NATIVE;
    }
  }
  return;
}

Assistant:

PizCompressor::PizCompressor
    (const Header &hdr,
     size_t maxScanLineSize,
     size_t numScanLines)
:
    Compressor (hdr),
    _maxScanLineSize (maxScanLineSize),
    _format (XDR),
    _numScanLines (numScanLines),
    _tmpBuffer (0),
    _outBuffer (0),
    _numChans (0),
    _channels (hdr.channels()),
    _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void) _maxScanLineSize;
    size_t tmpBufferSize = uiMult (maxScanLineSize, numScanLines) / 2;

    size_t outBufferSize =
                uiAdd (uiMult (maxScanLineSize, numScanLines),
                       size_t (65536 + 8192));

    _tmpBuffer = new unsigned short
            [checkArraySize (tmpBufferSize, sizeof (unsigned short))];

    _outBuffer = new char [outBufferSize];

    const ChannelList &channels = header().channels();
    bool onlyHalfChannels = true;

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	_numChans++;

	assert (pixelTypeSize (c.channel().type) % pixelTypeSize (HALF) == 0);

	if (c.channel().type != HALF)
	    onlyHalfChannels = false;
    }

    _channelData = new ChannelData[_numChans];

    const Box2i &dataWindow = hdr.dataWindow();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native format
    // if all image channels are of type HALF, and if the Xdr and the
    // native represenations of a half have the same size.
    //

    if (onlyHalfChannels && (sizeof (half) == pixelTypeSize (HALF)))
	_format = NATIVE;
}